

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O2

double __thiscall cppmetrics::WeightedSnapshot::get_value(WeightedSnapshot *this,double quantile)

{
  pointer pEVar1;
  pointer pEVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_var_01;
  domain_error *this_00;
  pointer pEVar7;
  difference_type __d;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined4 extraout_var_00;
  
  if ((0.0 <= quantile) && (quantile <= 1.0)) {
    iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[3])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      dVar10 = 0.0;
    }
    else {
      pEVar1 = (this->m_elements).
               super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->m_elements).
               super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = ((long)pEVar2 - (long)pEVar1) / 0x18;
      pEVar7 = pEVar1;
      uVar9 = ((long)pEVar2 - (long)pEVar1) % 0x18;
      while (uVar4 = uVar8, 0 < (long)uVar4) {
        uVar8 = uVar4 >> 1;
        uVar9 = uVar8;
        if (pEVar7[uVar8].quantile <= quantile && quantile != pEVar7[uVar8].quantile) {
          uVar9 = ~uVar8 + uVar4;
          pEVar7 = pEVar7 + uVar8 + 1;
          uVar8 = uVar9;
        }
      }
      if (pEVar7 == pEVar1) {
        iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[4])(this,pEVar2,uVar9);
        lVar6 = CONCAT44(extraout_var_00,iVar3);
      }
      else if (pEVar7 == pEVar2) {
        iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[6])(this);
        lVar6 = CONCAT44(extraout_var_01,iVar3);
      }
      else {
        dVar10 = pEVar7->quantile;
        lVar6 = -0x18;
        lVar5 = 0;
        if (quantile < dVar10) {
          lVar5 = lVar6;
        }
        if (NAN(dVar10)) {
          lVar5 = lVar6;
        }
        if (dVar10 < quantile) {
          lVar5 = lVar6;
        }
        lVar6 = *(long *)((long)&pEVar7->value + lVar5);
      }
      dVar10 = (double)lVar6;
    }
    return dVar10;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this_00,"Quantile must be between 0.0 and 1.0");
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}